

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_s_ikdata(xr_ogf_v3 *this,xr_reader *r)

{
  bool bVar1;
  reference ppxVar2;
  __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
  local_28;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  local_28._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar1) break;
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    bone_io::import_ikdata((bone_io *)*ppxVar2,r);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x19);
  return;
}

Assistant:

void xr_ogf_v3::load_s_ikdata(xr_reader& r)
{
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
		static_cast<bone_io*>(*it)->import_ikdata(r);
	set_chunk_loaded(OGF3_S_IKDATA);
}